

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_x.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinSCAN_X>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps,double *vrho,
               double *vsigma,double *vlapl,double *vtau)

{
  undefined8 *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double y;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double in_XMM1_Qa;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  double t347;
  double t342;
  double t339;
  double t338;
  double t334;
  double t333;
  double t332;
  double t331;
  double t327;
  double t326;
  double t325;
  double t323;
  double t319;
  double t318;
  double t312;
  double t310;
  double t306;
  double t303;
  double t302;
  double t300;
  double t299;
  double t294;
  double t291;
  double t290;
  double t286;
  double t285;
  double t284;
  double t283;
  double t281;
  double t279;
  double t278;
  double t277;
  double t275;
  double t274;
  double t271;
  double t269;
  double t267;
  double t265;
  double t263;
  double t262;
  double t261;
  double t252;
  double t248;
  double t246;
  double t245;
  double t242;
  double t238;
  double t236;
  double t234;
  double t232;
  double t231;
  double t230;
  double t228;
  double t227;
  double t226;
  double t221;
  double t218;
  double t217;
  double t213;
  double t212;
  double t211;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t203;
  double t200;
  double t199;
  double t197;
  double t195;
  double t194;
  double t191;
  double t187;
  double t184;
  double t182;
  double t172;
  double t171;
  double t170;
  double t169;
  double t161;
  double t160;
  double t158;
  double t155;
  double t154;
  double t152;
  double t151;
  double t149;
  double t143;
  double t142;
  double t138;
  double t137;
  double t133;
  double t132;
  double t130;
  double t128;
  double t127;
  double t124;
  double t122;
  double t119;
  double t118;
  double t117;
  double t115;
  double t112;
  double t111;
  double t110;
  double t109;
  double t106;
  double t103;
  double t102;
  double t101;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t94;
  double t93;
  double t90;
  double t89;
  double t88;
  double t83;
  double t82;
  double t81;
  double t78;
  double t76;
  double t74;
  double t73;
  double t67;
  double t66;
  double t65;
  double t62;
  double t61;
  double t60;
  double t56;
  double t55;
  double t50;
  double t48;
  double t47;
  double t46;
  double t45;
  double t35;
  double t34;
  double t33;
  double t31;
  double t30;
  double t29;
  double t20;
  double t19;
  double t18;
  double t16;
  double t14;
  double t12;
  double t11;
  double t9;
  double t8;
  double t3;
  double t257;
  double t210;
  double t168;
  double t167;
  double t166;
  double t165;
  double t148;
  double t126;
  double t125;
  double t44;
  double t43;
  double t42;
  double t40;
  double t39;
  double t28;
  double t26;
  double t25;
  double t24;
  double t27;
  double t23;
  double t22;
  double t21;
  double t5;
  double t4;
  double in_stack_fffffffffffff9a8;
  double x;
  
  x = 1e-15;
  dVar1 = (double)(-(ulong)(in_XMM0_Qa * 0.5 <= 1e-15) & 0x3ff0000000000000);
  piecewise_functor_5<double>(false,-0.999999999999999,false,0.999999999999999,0.0);
  dVar2 = safe_math::cbrt<double>(1.00126553281154e-317);
  dVar3 = safe_math::cbrt<double>(1.00127689632139e-317);
  dVar4 = piecewise_functor_3<double>(false,dVar2 * x,dVar3);
  dVar2 = dVar4 * 0.9847450218426964;
  dVar3 = safe_math::cbrt<double>(1.00132580882033e-317);
  dVar28 = in_XMM0_Qa * in_XMM0_Qa;
  dVar29 = dVar3 * dVar3;
  dVar30 = (1.0 / dVar29) / dVar28;
  dVar31 = in_XMM1_Qa * 1.5874010519681996 * dVar30;
  dVar32 = in_XMM1_Qa * in_XMM1_Qa;
  dVar33 = dVar28 * dVar28;
  dVar5 = safe_math::exp<double>(1.00150515464977e-317);
  dVar6 = ((1.0 / dVar3) / (dVar33 * in_XMM0_Qa)) * dVar5;
  dVar7 = safe_math::sqrt<double>(1.001531340129e-317);
  dVar34 = dVar7 * 1.8171205928321397 * 0.21733691746289932;
  dVar35 = (double)CONCAT44(in_XMM3_Db,in_XMM3_Da) * 1.5874010519681996;
  dVar36 = 1.0 / (dVar29 * in_XMM0_Qa);
  dVar37 = (dVar35 * dVar36 + dVar31 * -0.125) * 0.5555555555555556 * 1.8171205928321397 *
           0.21733691746289932;
  dVar8 = 1.0 - dVar37;
  dVar9 = safe_math::exp<double>(1.00168351234792e-317);
  dVar10 = dVar34 * 0.0005401234567901234 * dVar31 + (dVar7 * dVar8 * dVar9) / 100.0;
  dVar31 = dVar31 * 0.3949273883044934 * 0.0051440329218107 + 0.065 +
           (dVar32 * 1.2599210498948732 * 0.01900177337214953 * dVar6) / 288.0 + dVar10 * dVar10;
  dVar11 = (1.0 - 0.065 / dVar31) * 0.065 + 1.0;
  dVar12 = (double)(-(ulong)(dVar37 <= 1.0) & 0x3ff0000000000000);
  dVar13 = safe_math::log<double>(1.00184507181411e-317);
  dVar13 = dVar13 / (0.667 - dVar13);
  dVar38 = (double)(-(ulong)(-dVar13 < dVar37) & 0x3ff0000000000000);
  dVar39 = (double)(-(ulong)(dVar37 < -dVar13) & 0x3ff0000000000000);
  dVar13 = piecewise_functor_3<double>((bool)(-(dVar39 != 0.0) & 1),dVar37,-dVar13);
  dVar40 = dVar13 * 0.667;
  dVar13 = 1.0 - dVar13;
  dVar14 = 1.0 / dVar13;
  y = safe_math::exp<double>(1.00201107787111e-317);
  dVar15 = piecewise_functor_3<double>((bool)(-(dVar38 != 0.0) & 1),0.0,y);
  dVar16 = safe_math::log<double>(1.00206690728909e-317);
  dVar16 = (0.8 - dVar16) / dVar16;
  dVar17 = (double)(-(ulong)(dVar37 < -dVar16) & 0x3ff0000000000000);
  dVar16 = piecewise_functor_3<double>(dVar17 != 0.0,-dVar16,dVar37);
  dVar37 = safe_math::exp<double>(1.00217856612505e-317);
  dVar18 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar37 * -1.24);
  dVar15 = piecewise_functor_3<double>(dVar12 != 0.0,dVar15,dVar18);
  dVar18 = 1.0 - dVar15;
  dVar15 = dVar11 * dVar18 + dVar15 * 1.174;
  safe_math::sqrt<double>(1.00229022496101e-317);
  dVar19 = safe_math::sqrt<double>(1.00230158847087e-317);
  dVar20 = safe_math::sqrt<double>(1.00236038228272e-317);
  dVar21 = safe_math::exp<double>(1.00238014490855e-317);
  dVar22 = 1.0 - dVar21;
  dVar23 = piecewise_functor_3<double>(dVar1 != 0.0,0.0,dVar2 * -0.375 * dVar3 * dVar15 * dVar22);
  dVar31 = 0.0042250000000000005 / (dVar31 * dVar31);
  dVar24 = in_XMM1_Qa * 1.5874010519681996 * ((1.0 / dVar29) / (dVar28 * in_XMM0_Qa));
  dVar35 = dVar35 * -1.6666666666666667 * dVar30 + dVar24 / 3.0;
  dVar25 = dVar9 * 0.3949273883044934;
  dVar26 = dVar7 * dVar8 * dVar8;
  dVar8 = dVar35 * 1.8171205928321397 * 0.5555555555555556 * 0.21733691746289932;
  dVar27 = piecewise_functor_3<double>(dVar39 != 0.0,dVar8,0.0);
  dVar13 = 1.0 / (dVar13 * dVar13);
  dVar27 = piecewise_functor_3<double>
                     (dVar38 != 0.0,0.0,(dVar27 * -0.667 * dVar14 + -(dVar40 * dVar13 * dVar27)) * y
                     );
  dVar16 = 1.0 / ((1.0 - dVar16) * (1.0 - dVar16));
  dVar8 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar8);
  dVar8 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar16 * -0.992 * dVar8 * dVar37);
  dVar8 = piecewise_functor_3<double>(dVar12 != 0.0,dVar27,dVar8);
  dVar27 = safe_math::pow<double,double>(x,in_stack_fffffffffffff9a8);
  dVar4 = dVar27 * dVar27 * dVar27 * dVar27 * dVar27 * dVar4;
  dVar20 = (1.0 / dVar20) /
           (dVar19 * 1.2599210498948732 * 1.5393389262365065 * ((1.0 / dVar3) / in_XMM0_Qa));
  dVar8 = piecewise_functor_3<double>
                    (dVar1 != 0.0,0.0,
                     -(dVar4 * (1.0 / dVar28) * dVar15 * dVar20 * 1.6891736332904388) *
                     dVar19 * 1.2599210498948732 * 1.5393389262365065 * dVar21 +
                     -(dVar2 * 0.375 * dVar3 *
                      (dVar8 * 1.174 +
                      dVar31 * (dVar10 * 2.0 *
                                (dVar34 * -0.001440329218106996 * dVar24 +
                                 -((dVar7 * dVar35 * dVar25) / 180.0) +
                                (dVar26 * dVar35 * dVar25) / 180.0) +
                               dVar32 * in_XMM1_Qa * 5.71414204831218e-06 *
                               (1.0 / (dVar33 * dVar33 * in_XMM0_Qa)) * dVar5 +
                               dVar24 * -0.005417385299101418 +
                               -((dVar32 * 1.2599210498948732 * 0.01900177337214953 *
                                 ((1.0 / dVar3) / (dVar33 * dVar28)) * dVar5) / 54.0)) * dVar18 +
                      -(dVar11 * dVar8))) * dVar22 +
                     (-dVar2 * (1.0 / dVar29) * dVar15 * dVar22) / 8.0);
  dVar24 = dVar30 * 1.5874010519681996 * 0.3949273883044934;
  dVar26 = dVar26 * 1.5874010519681996;
  dVar35 = dVar24 * 0.06944444444444445;
  dVar27 = piecewise_functor_3<double>(dVar39 != 0.0,-dVar35,0.0);
  dVar27 = piecewise_functor_3<double>
                     (dVar38 != 0.0,0.0,
                      (-(dVar27 * 0.667) * dVar14 + -(dVar40 * dVar13 * dVar27)) * y);
  dVar35 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,-dVar35);
  dVar35 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar16 * -0.992 * dVar35 * dVar37);
  dVar35 = piecewise_functor_3<double>(dVar12 != 0.0,dVar27,dVar35);
  dVar5 = piecewise_functor_3<double>
                    (dVar1 != 0.0,0.0,
                     dVar2 * -0.375 * dVar3 *
                     (dVar35 * 1.174 +
                     dVar31 * (dVar10 * 2.0 *
                               ((dVar7 * 1.8171205928321397 * 0.0005401234567901234 *
                                 0.34500085141213216 * dVar30 +
                                (dVar7 * 1.5874010519681996 * dVar30 * dVar25) / 1440.0) -
                               (dVar26 * dVar30 * 1.8171205928321397 * dVar9 * 0.21733691746289932)
                               / 1440.0) +
                              -(dVar32 * 2.1428032681170676e-06 * (1.0 / (dVar33 * dVar33))) * dVar5
                              + dVar24 * 0.0051440329218107 +
                                (in_XMM1_Qa * 1.2599210498948732 * 0.01900177337214953 * dVar6) /
                                144.0) * dVar18 + -(dVar11 * dVar35)) * dVar22 +
                     dVar4 * (1.0 / in_XMM0_Qa) * dVar15 * dVar20 * 0.6334401124839145 *
                     (1.0 / dVar19) * 1.5393389262365065 * 1.2599210498948732 * dVar21);
  dVar6 = dVar36 * 1.5874010519681996 * 0.5555555555555556 * 0.3949273883044934;
  dVar15 = piecewise_functor_3<double>(dVar39 != 0.0,dVar6,0.0);
  dVar13 = piecewise_functor_3<double>
                     (dVar38 != 0.0,0.0,(-dVar40 * dVar13 * dVar15 + -(dVar15 * 0.667 * dVar14)) * y
                     );
  dVar6 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar6);
  dVar6 = piecewise_functor_3<double>(dVar17 != 0.0,0.0,dVar16 * -0.992 * dVar6 * dVar37);
  dVar6 = piecewise_functor_3<double>(dVar12 != 0.0,dVar13,dVar6);
  dVar1 = piecewise_functor_3<double>
                    (dVar1 != 0.0,0.0,
                     dVar2 * -0.375 * dVar3 *
                     (dVar6 * 1.174 +
                     dVar31 * 2.0 *
                     dVar10 * ((dVar26 * dVar36 * 1.8171205928321397 * dVar9 * 0.21733691746289932)
                               / 180.0 - (dVar7 * 1.5874010519681996 * dVar36 * dVar25) / 180.0) *
                     dVar18 + -(dVar11 * dVar6)) * dVar22);
  *in_RDI = dVar23 * 2.0;
  *in_RSI = in_XMM0_Qa * 2.0 * dVar8 + dVar23 * 2.0;
  *in_RDX = in_XMM0_Qa * 2.0 * dVar5;
  *in_RCX = 0;
  *in_R8 = in_XMM0_Qa * 2.0 * dVar1;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps, double& vrho, double& vsigma, double& vlapl, double& vtau ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t4 = constants::m_cbrt_3;
    constexpr double t5 = constants::m_cbrt_pi;
    constexpr double t21 = constants::m_cbrt_6;
    constexpr double t22 = constants::m_pi_sq;
    constexpr double t23 = constants::m_cbrt_pi_sq;
    constexpr double t27 = constants::m_cbrt_2;
    constexpr double t24 = t23 * t23;
    constexpr double t25 = 0.1e1 / t24;
    constexpr double t26 = t21 * t25;
    constexpr double t28 = t27 * t27;
    constexpr double t39 = 0.1e3 / 0.6561e4 / k1 - 0.73e2 / 0.648e3;
    constexpr double t40 = t21 * t21;
    constexpr double t42 = t23 * t22;
    constexpr double t43 = 0.1e1 / t42;
    constexpr double t44 = t39 * t40 * t43;
    constexpr double t125 = 0.1e1 / t23;
    constexpr double t126 = t40 * t125;
    constexpr double t148 = k1 * k1;
    constexpr double t165 = t39 * t39;
    constexpr double t166 = t22 * t22;
    constexpr double t167 = 0.1e1 / t166;
    constexpr double t168 = t165 * t167;
    constexpr double t210 = d * c2;
    constexpr double t257 = t25 * t28;


    const double t3 = rho / 0.2e1 <= dens_tol;
    const double t8 = 0.1e1 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t11 = piecewise_functor_5( t8, t9, t8, -t9, 0.0 );
    const double t12 = 0.1e1 + t11;
    const double t14 = safe_math::cbrt( zeta_tol );
    const double t16 = safe_math::cbrt( t12 );
    const double t18 = piecewise_functor_3( t12 <= zeta_tol, t14 * zeta_tol, t16 * t12 );
    const double t19 = t4 / t5 * t18;
    const double t20 = safe_math::cbrt( rho );
    const double t29 = sigma * t28;
    const double t30 = rho * rho;
    const double t31 = t20 * t20;
    const double t33 = 0.1e1 / t31 / t30;
    const double t34 = t29 * t33;
    const double t35 = t26 * t34;
    const double t45 = sigma * sigma;
    const double t46 = t45 * t27;
    const double t47 = t30 * t30;
    const double t48 = t47 * rho;
    const double t50 = 0.1e1 / t20 / t48;
    const double t55 = safe_math::exp( -0.27e2 / 0.8e2 * t39 * t21 * t25 * t34 );
    const double t56 = t50 * t55;
    const double t60 = safe_math::sqrt( 0.146e3 );
    const double t61 = t60 * t21;
    const double t62 = t61 * t25;
    const double t65 = tau * t28;
    const double t66 = t31 * rho;
    const double t67 = 0.1e1 / t66;
    const double t73 = 0.5e1 / 0.9e1 * ( t65 * t67 - t34 / 0.8e1 ) * t21 * t25;
    const double t74 = 0.1e1 - t73;
    const double t76 = t74 * t74;
    const double t78 = safe_math::exp( -t76 / 0.2e1 );
    const double t81 = 0.7e1 / 0.1296e5 * t62 * t34 + t60 * t74 * t78 / 0.1e3;
    const double t82 = t81 * t81;
    const double t83 = k1 + 0.5e1 / 0.972e3 * t35 + t44 * t46 * t56 / 0.288e3 + t82;
    const double t88 = 0.1e1 + k1 * ( 0.1e1 - k1 / t83 );
    const double t89 = t73 <= 0.1e1;
    const double t90 = safe_math::log( DBL_EPSILON );
    const double t93 = t90 / ( -t90 + c1 );
    const double t94 = -t93 < t73;
    const double t95 = t73 < -t93;
    const double t96 = piecewise_functor_3( t95, t73, -t93 );
    const double t97 = c1 * t96;
    const double t98 = 0.1e1 - t96;
    const double t99 = 0.1e1 / t98;
    const double t101 = safe_math::exp( -t97 * t99 );
    const double t102 = piecewise_functor_3( t94, 0.0, t101 );
    const double t103 = fabs( d );
    const double t106 = safe_math::log( DBL_EPSILON / t103 );
    const double t109 = ( -t106 + c2 ) / t106;
    const double t110 = t73 < -t109;
    const double t111 = piecewise_functor_3( t110, -t109, t73 );
    const double t112 = 0.1e1 - t111;
    const double t115 = safe_math::exp( c2 / t112 );
    const double t117 = piecewise_functor_3( t110, 0.0, -d * t115 );
    const double t118 = piecewise_functor_3( t89, t102, t117 );
    const double t119 = 0.1e1 - t118;
    const double t122 = t88 * t119 + 0.1174e1 * t118;
    const double t124 = safe_math::sqrt( 0.3e1 );
    const double t127 = safe_math::sqrt( sigma );
    const double t128 = t127 * t27;
    const double t130 = 0.1e1 / t20 / rho;
    const double t132 = t126 * t128 * t130;
    const double t133 = safe_math::sqrt( t132 );
    const double t137 = safe_math::exp( -0.98958e1 * t124 / t133 );
    const double t138 = 0.1e1 - t137;
    const double t142 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t122 * t138 );
    const double t143 = 0.1e1 / t31;
    const double t149 = t83 * t83;
    const double t151 = t148 / t149;
    const double t152 = t30 * rho;
    const double t154 = 0.1e1 / t31 / t152;
    const double t155 = t29 * t154;
    const double t158 = t47 * t30;
    const double t160 = 0.1e1 / t20 / t158;
    const double t161 = t160 * t55;
    const double t169 = t45 * sigma;
    const double t170 = t47 * t47;
    const double t171 = t170 * rho;
    const double t172 = 0.1e1 / t171;
    const double t182 = -0.5e1 / 0.3e1 * t65 * t33 + t155 / 0.3e1;
    const double t184 = t26 * t78;
    const double t187 = t60 * t76;
    const double t191 = -0.7e1 / 0.486e4 * t62 * t155 - t60 * t182 * t184 / 0.18e3 + t187 * t182 * t184 / 0.18e3;
    const double t194 = -0.1e2 / 0.729e3 * t26 * t155 - t44 * t46 * t161 / 0.54e2 + 0.3e1 / 0.8e2 * t168 * t169 * t172 * t55 + 0.2e1 * t81 * t191;
    const double t195 = t194 * t119;
    const double t197 = t182 * t21;
    const double t199 = 0.5e1 / 0.9e1 * t197 * t25;
    const double t200 = piecewise_functor_3( t95, t199, 0.0 );
    const double t203 = t98 * t98;
    const double t204 = 0.1e1 / t203;
    const double t205 = t204 * t200;
    const double t207 = -c1 * t200 * t99 - t97 * t205;
    const double t208 = t207 * t101;
    const double t209 = piecewise_functor_3( t94, 0.0, t208 );
    const double t211 = t112 * t112;
    const double t212 = 0.1e1 / t211;
    const double t213 = piecewise_functor_3( t110, 0.0, t199 );
    const double t217 = piecewise_functor_3( t110, 0.0, -t210 * t212 * t213 * t115 );
    const double t218 = piecewise_functor_3( t89, t209, t217 );
    const double t221 = t151 * t195 - t88 * t218 + 0.1174e1 * t218;
    const double t226 = safe_math::pow( 0.3e1, 0.1e1 / 0.6e1 );
    const double t227 = t226 * t226;
    const double t228 = t227 * t227;
    const double t230 = t228 * t226 * t18;
    const double t231 = 0.1e1 / t30;
    const double t232 = t231 * t122;
    const double t234 = 0.1e1 / t133 / t132;
    const double t236 = t230 * t232 * t234;
    const double t238 = t126 * t128 * t137;
    const double t242 = piecewise_functor_3( t3, 0.0, -t19 * t143 * t122 * t138 / 0.8e1 - 0.3e1 / 0.8e1 * t19 * t20 * t221 * t138 - 0.16891736332904387511e1 * t236 * t238 );
    const double t245 = t28 * t33;
    const double t246 = t245 * t26;
    const double t248 = sigma * t27;
    const double t252 = 0.1e1 / t170;
    const double t261 = t60 * t28;
    const double t262 = t261 * t33;
    const double t263 = t262 * t184;
    const double t265 = t187 * t28;
    const double t267 = t25 * t78;
    const double t269 = t265 * t33 * t21 * t267;
    const double t271 = 0.7e1 / 0.1296e5 * t61 * t257 * t33 + t263 / 0.144e4 - t269 / 0.144e4;
    const double t274 = 0.5e1 / 0.972e3 * t246 + t44 * t248 * t56 / 0.144e3 - 0.9e1 / 0.64e3 * t168 * t45 * t252 * t55 + 0.2e1 * t81 * t271;
    const double t275 = t274 * t119;
    const double t277 = 0.5e1 / 0.72e2 * t246;
    const double t278 = piecewise_functor_3( t95, -t277, 0.0 );
    const double t279 = c1 * t278;
    const double t281 = t204 * t278;
    const double t283 = -t279 * t99 - t97 * t281;
    const double t284 = t283 * t101;
    const double t285 = piecewise_functor_3( t94, 0.0, t284 );
    const double t286 = piecewise_functor_3( t110, 0.0, -t277 );
    const double t290 = piecewise_functor_3( t110, 0.0, -t210 * t212 * t286 * t115 );
    const double t291 = piecewise_functor_3( t89, t285, t290 );
    const double t294 = t151 * t275 - t88 * t291 + 0.1174e1 * t291;
    const double t299 = 0.1e1 / rho;
    const double t300 = t299 * t122;
    const double t302 = t230 * t300 * t234;
    const double t303 = 0.1e1 / t127;
    const double t306 = t126 * t303 * t27 * t137;
    const double t310 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t294 * t138 + 0.63344011248391453166e0 * t302 * t306 );
    const double t312 = t261 * t67;
    const double t318 = t265 * t67 * t21 * t267 / 0.18e3 - t312 * t184 / 0.18e3;
    const double t319 = t81 * t318;
    const double t323 = t28 * t67;
    const double t325 = 0.5e1 / 0.9e1 * t323 * t26;
    const double t326 = piecewise_functor_3( t95, t325, 0.0 );
    const double t327 = c1 * t326;
    const double t331 = -t97 * t204 * t326 - t327 * t99;
    const double t332 = t331 * t101;
    const double t333 = piecewise_functor_3( t94, 0.0, t332 );
    const double t334 = piecewise_functor_3( t110, 0.0, t325 );
    const double t338 = piecewise_functor_3( t110, 0.0, -t210 * t212 * t334 * t115 );
    const double t339 = piecewise_functor_3( t89, t333, t338 );
    const double t342 = 0.2e1 * t151 * t319 * t119 - t88 * t339 + 0.1174e1 * t339;
    const double t347 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t342 * t138 );


    eps = 0.2e1 * t142;
    vrho = 0.2e1 * rho * t242 + 0.2e1 * t142;
    vsigma = 0.2e1 * rho * t310;
    vlapl = 0.e0;
    vtau = 0.2e1 * rho * t347;

  }